

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void __thiscall glu::sl::ShaderParser::parseValueBlock(ShaderParser *this,ValueBlock *valueBlock)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ValueBlock *local_18;
  ValueBlock *valueBlock_local;
  ShaderParser *this_local;
  
  local_18 = valueBlock;
  valueBlock_local = (ValueBlock *)this;
  advanceToken(this,TOKEN_VALUES);
  advanceToken(this,TOKEN_LEFT_BRACE);
  while( true ) {
    while (((this->m_curToken == TOKEN_UNIFORM || (this->m_curToken == TOKEN_INPUT)) ||
           (this->m_curToken == TOKEN_OUTPUT))) {
      parseValue(this,local_18);
    }
    if (this->m_curToken == TOKEN_RIGHT_BRACE) break;
    std::operator+(&local_38,"unexpected token when parsing a value block: ",&this->m_curTokenStr);
    parseError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  advanceToken(this,TOKEN_RIGHT_BRACE);
  return;
}

Assistant:

void ShaderParser::parseValueBlock (ValueBlock& valueBlock)
{
	PARSE_DBG(("    parseValueBlock()\n"));
	advanceToken(TOKEN_VALUES);
	advanceToken(TOKEN_LEFT_BRACE);

	for (;;)
	{
		if (m_curToken == TOKEN_UNIFORM || m_curToken == TOKEN_INPUT || m_curToken == TOKEN_OUTPUT)
			parseValue(valueBlock);
		else if (m_curToken == TOKEN_RIGHT_BRACE)
			break;
		else
			parseError(string("unexpected token when parsing a value block: " + m_curTokenStr));
	}

	advanceToken(TOKEN_RIGHT_BRACE);
}